

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemIOCallback.cpp
# Opt level: O0

ssize_t __thiscall
libebml::MemIOCallback::write(MemIOCallback *this,int __fd,void *__buf,size_t __n)

{
  binary *pbVar1;
  undefined4 in_register_00000034;
  size_t Size_local;
  void *Buffer_local;
  MemIOCallback *this_local;
  
  if (this->dataBufferMemorySize < this->dataBufferPos + (long)__buf) {
    pbVar1 = (binary *)realloc(this->dataBuffer,this->dataBufferPos + (long)__buf);
    this->dataBuffer = pbVar1;
  }
  memcpy(this->dataBuffer + this->dataBufferPos,(void *)CONCAT44(in_register_00000034,__fd),
         (size_t)__buf);
  this->dataBufferPos = (long)__buf + this->dataBufferPos;
  if (this->dataBufferTotalSize < this->dataBufferPos) {
    this->dataBufferTotalSize = this->dataBufferPos;
  }
  return (ssize_t)__buf;
}

Assistant:

size_t MemIOCallback::write(const void *Buffer, size_t Size)
{
  if (dataBufferMemorySize < dataBufferPos + Size) {
    //We need more memory!
    dataBuffer = (binary *)realloc((void *)dataBuffer, dataBufferPos + Size);
  }
  memcpy(dataBuffer+dataBufferPos, Buffer, Size);
  dataBufferPos += Size;
  if (dataBufferPos > dataBufferTotalSize)
    dataBufferTotalSize = dataBufferPos;

  return Size;
}